

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_device.cpp
# Opt level: O2

void embree::deleteGeometry(ISPCGeometry *geom)

{
  void *in_RSI;
  
  if (geom != (ISPCGeometry *)0x0) {
    switch(geom->type) {
    case TRIANGLE_MESH:
      ISPCTriangleMesh::~ISPCTriangleMesh((ISPCTriangleMesh *)geom);
      ISPCTriangleMesh::operator_delete((ISPCTriangleMesh *)geom,in_RSI);
      return;
    case SUBDIV_MESH:
      ISPCSubdivMesh::~ISPCSubdivMesh((ISPCSubdivMesh *)geom);
      ISPCSubdivMesh::operator_delete((ISPCSubdivMesh *)geom,in_RSI);
      return;
    case CURVES:
      ISPCHairSet::~ISPCHairSet((ISPCHairSet *)geom);
      ISPCHairSet::operator_delete((ISPCHairSet *)geom,in_RSI);
      return;
    case INSTANCE:
      ISPCInstance::~ISPCInstance((ISPCInstance *)geom);
      ISPCInstance::operator_delete((ISPCInstance *)geom,in_RSI);
      return;
    case INSTANCE_ARRAY:
      ISPCInstanceArray::~ISPCInstanceArray((ISPCInstanceArray *)geom);
      ISPCInstanceArray::operator_delete((ISPCInstanceArray *)geom,in_RSI);
      return;
    case GROUP:
      ISPCGroup::~ISPCGroup((ISPCGroup *)geom);
      ISPCGroup::operator_delete((ISPCGroup *)geom,in_RSI);
      return;
    case QUAD_MESH:
      ISPCQuadMesh::~ISPCQuadMesh((ISPCQuadMesh *)geom);
      ISPCQuadMesh::operator_delete((ISPCQuadMesh *)geom,in_RSI);
      return;
    case GRID_MESH:
      ISPCGridMesh::~ISPCGridMesh((ISPCGridMesh *)geom);
      ISPCGridMesh::operator_delete((ISPCGridMesh *)geom,in_RSI);
      return;
    case POINTS:
      ISPCPointSet::~ISPCPointSet((ISPCPointSet *)geom);
      ISPCPointSet::operator_delete((ISPCPointSet *)geom,in_RSI);
      return;
    }
  }
  return;
}

Assistant:

void deleteGeometry(ISPCGeometry* geom)
  {
    if (geom == nullptr)
      return;
    
    switch (geom->type) {
    case TRIANGLE_MESH: delete (ISPCTriangleMesh*) geom; break;
    case SUBDIV_MESH  : delete (ISPCSubdivMesh*) geom; break;
    case INSTANCE: delete (ISPCInstance*) geom; break;
    case INSTANCE_ARRAY: delete (ISPCInstanceArray*) geom; break;
    case GROUP: delete (ISPCGroup*) geom; break;
    case QUAD_MESH: delete (ISPCQuadMesh*) geom; break;
    case CURVES: delete (ISPCHairSet*) geom; break;
    case GRID_MESH: delete (ISPCGridMesh*) geom; break;
    case POINTS: delete (ISPCPointSet*) geom; break;
    default: assert(false); break;
    }
  }